

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnObj.c
# Opt level: O0

int Wln_ObjAddFanins(Wln_Ntk_t *p,int iObj,Vec_Int_t *vFanins)

{
  int iVar1;
  undefined4 local_24;
  int iFanin;
  int i;
  Vec_Int_t *vFanins_local;
  int iObj_local;
  Wln_Ntk_t *p_local;
  
  for (local_24 = 0; iVar1 = Vec_IntSize(vFanins), local_24 < iVar1; local_24 = local_24 + 1) {
    iVar1 = Vec_IntEntry(vFanins,local_24);
    Wln_ObjAddFanin(p,iObj,iVar1);
  }
  return iObj;
}

Assistant:

int Wln_ObjAddFanins( Wln_Ntk_t * p, int iObj, Vec_Int_t * vFanins )
{
    int i, iFanin;
    Vec_IntForEachEntry( vFanins, iFanin, i )
        Wln_ObjAddFanin( p, iObj, iFanin );
    return iObj;
}